

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Checkpoint(sqlite3 *db,int iDb,int eMode,int *pnLog,int *pnCkpt)

{
  Btree *p;
  BtShared *pBVar1;
  Pager *pPVar2;
  bool bVar3;
  int iVar4;
  _func_int_void_ptr *xBusy;
  long lVar5;
  int iVar6;
  ulong uVar7;
  
  lVar5 = 8;
  iVar6 = 0;
  bVar3 = false;
  for (uVar7 = 0; (iVar6 == 0 && ((long)uVar7 < (long)db->nDb)); uVar7 = uVar7 + 1) {
    iVar6 = 0;
    if (iDb == 10 || (uint)iDb == uVar7) {
      p = *(Btree **)((long)&db->aDb->zDbSName + lVar5);
      if (p == (Btree *)0x0) {
        iVar4 = 0;
      }
      else {
        pBVar1 = p->pBt;
        sqlite3BtreeEnter(p);
        iVar4 = 6;
        if (pBVar1->inTransaction == '\0') {
          pPVar2 = pBVar1->pPager;
          if (pPVar2->pWal == (Wal *)0x0) {
            iVar4 = 0;
          }
          else {
            if (eMode == 0) {
              xBusy = (_func_int_void_ptr *)0x0;
            }
            else {
              xBusy = pPVar2->xBusyHandler;
            }
            iVar4 = sqlite3WalCheckpoint
                              (pPVar2->pWal,p->db,eMode,xBusy,pPVar2->pBusyHandlerArg,
                               (uint)pPVar2->ckptSyncFlags,pPVar2->pageSize,(u8 *)pPVar2->pTmpSpace,
                               pnLog,pnCkpt);
          }
        }
        sqlite3BtreeLeave(p);
      }
      iVar6 = iVar4;
      if (iVar4 == 5) {
        iVar6 = 0;
      }
      if (iVar4 == 5) {
        bVar3 = true;
      }
      pnLog = (int *)0x0;
      pnCkpt = (int *)0x0;
    }
    lVar5 = lVar5 + 0x20;
  }
  iVar4 = 5;
  if (!bVar3) {
    iVar4 = iVar6;
  }
  if (iVar6 != 0) {
    iVar4 = iVar6;
  }
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3Checkpoint(sqlite3 *db, int iDb, int eMode, int *pnLog, int *pnCkpt){
  int rc = SQLITE_OK;             /* Return code */
  int i;                          /* Used to iterate through attached dbs */
  int bBusy = 0;                  /* True if SQLITE_BUSY has been encountered */

  assert( sqlite3_mutex_held(db->mutex) );
  assert( !pnLog || *pnLog==-1 );
  assert( !pnCkpt || *pnCkpt==-1 );

  for(i=0; i<db->nDb && rc==SQLITE_OK; i++){
    if( i==iDb || iDb==SQLITE_MAX_ATTACHED ){
      rc = sqlite3BtreeCheckpoint(db->aDb[i].pBt, eMode, pnLog, pnCkpt);
      pnLog = 0;
      pnCkpt = 0;
      if( rc==SQLITE_BUSY ){
        bBusy = 1;
        rc = SQLITE_OK;
      }
    }
  }

  return (rc==SQLITE_OK && bBusy) ? SQLITE_BUSY : rc;
}